

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

int anon_unknown.dwarf_3dd9c::MyItem::CompareWithSortSpecs(void *lhs,void *rhs)

{
  undefined4 *puVar1;
  int *in_RSI;
  int *in_RDI;
  int delta;
  ImGuiTableColumnSortSpecs *sort_spec;
  int n;
  MyItem *b;
  MyItem *a;
  int local_3c;
  int local_2c;
  
  local_2c = 0;
  while( true ) {
    if ((int)(anonymous_namespace)::MyItem::s_current_sort_specs[1] <= local_2c) {
      return *in_RDI - *in_RSI;
    }
    puVar1 = (undefined4 *)
             (*(anonymous_namespace)::MyItem::s_current_sort_specs + (long)local_2c * 0xc);
    local_3c = 0;
    switch(*puVar1) {
    case 0:
      local_3c = *in_RDI - *in_RSI;
      break;
    case 1:
      local_3c = strcmp(*(char **)(in_RDI + 2),*(char **)(in_RSI + 2));
      break;
    default:
      break;
    case 3:
      local_3c = in_RDI[4] - in_RSI[4];
      break;
    case 4:
      local_3c = strcmp(*(char **)(in_RDI + 2),*(char **)(in_RSI + 2));
    }
    if (0 < local_3c) break;
    if (local_3c < 0) {
      if (*(char *)(puVar1 + 2) != '\x01') {
        return 1;
      }
      return -1;
    }
    local_2c = local_2c + 1;
  }
  if (*(char *)(puVar1 + 2) != '\x01') {
    return -1;
  }
  return 1;
}

Assistant:

CompareWithSortSpecs(const void* lhs, const void* rhs)
    {
        const MyItem* a = (const MyItem*)lhs;
        const MyItem* b = (const MyItem*)rhs;
        for (int n = 0; n < s_current_sort_specs->SpecsCount; n++)
        {
            // Here we identify columns using the ColumnUserID value that we ourselves passed to TableSetupColumn()
            // We could also choose to identify columns based on their index (sort_spec->ColumnIndex), which is simpler!
            const ImGuiTableColumnSortSpecs* sort_spec = &s_current_sort_specs->Specs[n];
            int delta = 0;
            switch (sort_spec->ColumnUserID)
            {
            case MyItemColumnID_ID:             delta = (a->ID - b->ID);                break;
            case MyItemColumnID_Name:           delta = (strcmp(a->Name, b->Name));     break;
            case MyItemColumnID_Quantity:       delta = (a->Quantity - b->Quantity);    break;
            case MyItemColumnID_Description:    delta = (strcmp(a->Name, b->Name));     break;
            default: IM_ASSERT(0); break;
            }
            if (delta > 0)
                return (sort_spec->SortDirection == ImGuiSortDirection_Ascending) ? +1 : -1;
            if (delta < 0)
                return (sort_spec->SortDirection == ImGuiSortDirection_Ascending) ? -1 : +1;
        }

        // qsort() is instable so always return a way to differenciate items.
        // Your own compare function may want to avoid fallback on implicit sort specs e.g. a Name compare if it wasn't already part of the sort specs.
        return (a->ID - b->ID);
    }